

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O0

int __thiscall ncnn::Convolution1D_x86_avx::create_pipeline(Convolution1D_x86_avx *this,Option *opt)

{
  ulong uVar1;
  int iVar2;
  float *pfVar3;
  long in_RSI;
  Allocator *in_RDI;
  float *k00;
  int j;
  int i;
  int k;
  float *g00;
  int p;
  Mat g0;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  int elempack;
  int num_input;
  int in_stack_fffffffffffffe94;
  size_t in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  int _c;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  Mat local_138;
  float *local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  float *local_d8;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar4;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  Mat *in_stack_ffffffffffffff48;
  int local_80;
  int local_24;
  int local_20;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  if (*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x28]._vptr_Allocator) == 0) {
    uVar1 = (long)*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1e]._vptr_Allocator) /
            (long)*(int *)((undefined1 *)((long)&in_RDI[0x1a]._vptr_Allocator + 4) +
                          (long)in_RDI->_vptr_Allocator[-3]);
    iVar2 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                 (long)*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1a]._vptr_Allocator));
    local_20 = 1;
    local_24 = 1;
    if ((*(byte *)(in_RSI + 0x27) & 1) != 0) {
      if (iVar2 % 8 == 0) {
        in_stack_fffffffffffffebc = 8;
      }
      else {
        in_stack_fffffffffffffebc = 1;
        if (iVar2 % 4 == 0) {
          in_stack_fffffffffffffebc = 4;
        }
      }
      local_20 = in_stack_fffffffffffffebc;
      if (*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1a]._vptr_Allocator) % 8 == 0) {
        in_stack_fffffffffffffeb8 = 8;
        local_24 = in_stack_fffffffffffffeb8;
      }
      else {
        in_stack_fffffffffffffeb8 = 1;
        local_24 = in_stack_fffffffffffffeb8;
        if (*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1a]._vptr_Allocator) % 4 == 0) {
          in_stack_fffffffffffffeb8 = 4;
          local_24 = in_stack_fffffffffffffeb8;
        }
      }
    }
    ncnn::Mat::reshape(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                       ,in_stack_ffffffffffffff3c,
                       (Allocator *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    _c = local_24;
    ncnn::Mat::create((Mat *)CONCAT44(local_24,iVar2 / local_20),
                      *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1a]._vptr_Allocator),
                      in_stack_fffffffffffffea8,iVar4,in_stack_fffffffffffffe98,
                      in_stack_fffffffffffffe94,in_RDI);
    for (local_80 = 0;
        local_80 + local_24 + -1 <
        *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1a]._vptr_Allocator);
        local_80 = local_24 + local_80) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),_c);
      for (iVar4 = 0; iVar4 + local_20 + -1 < iVar2; iVar4 = local_20 + iVar4) {
        local_d8 = ncnn::Mat::row((Mat *)&stack0xffffffffffffff38,iVar4 / local_20);
        for (local_dc = 0;
            local_dc <
            *(int *)((undefined1 *)((long)&in_RDI[0x1a]._vptr_Allocator + 4) +
                    (long)in_RDI->_vptr_Allocator[-3]); local_dc = local_dc + 1) {
          for (local_e0 = 0; local_e0 < local_20; local_e0 = local_e0 + 1) {
            for (local_e4 = 0; local_e4 < local_24; local_e4 = local_e4 + 1) {
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ),_c);
              pfVar3 = ncnn::Mat::row(&local_138,iVar4 + local_e0);
              ncnn::Mat::~Mat((Mat *)0x92e5da);
              *local_d8 = pfVar3[local_dc];
              local_d8 = local_d8 + 1;
              local_f0 = pfVar3;
            }
          }
        }
      }
      ncnn::Mat::~Mat((Mat *)0x92e6dd);
    }
    ncnn::Mat::~Mat((Mat *)0x92e713);
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                float* g00 = g0.row(p / elempack);

                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}